

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O3

Comparison __thiscall
wasm::anon_unknown_0::
RecGroupComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:320:29)>
::compare(RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:320:29)>
          *this,HeapType a,HeapType b)

{
  ComparableRecGroupShape *pCVar1;
  key_type kVar2;
  HeapType HVar3;
  iterator iVar4;
  iterator iVar5;
  bool bVar6;
  bool bVar7;
  key_type local_40;
  HeapType a_local;
  HeapType b_local;
  HeapType local_28;
  
  if (a.id < 0x7d == b.id < 0x7d) {
    if (a.id < 0x7d) {
      if (a.id == b.id) {
        return EQ;
      }
      return GT - (a.id < b.id);
    }
    local_40.id = a.id;
    a_local = b;
    iVar4 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,&local_40);
    iVar5 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->indicesB)._M_h,&a_local);
    HVar3 = a_local;
    kVar2.id = local_40.id;
    if ((iVar4.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur
        != (__node_type *)0x0) ==
        (iVar5.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur
        != (__node_type *)0x0)) {
      if (iVar4.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
          _M_cur != (__node_type *)0x0) {
        if (*(uint *)((long)iVar4.
                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                            ._M_cur + 0x10) ==
            *(uint *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                            ._M_cur + 0x10)) {
          return EQ;
        }
        return GT - (*(uint *)((long)iVar4.
                                     super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                     ._M_cur + 0x10) <
                    *(uint *)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                    ._M_cur + 0x10));
      }
      pCVar1 = (this->compareTypes).a;
      b_local.id = local_40.id;
      local_28.id = a_local.id;
      if ((pCVar1->less).super__Function_base._M_manager != (_Manager_type)0x0) {
        bVar6 = (*(pCVar1->less)._M_invoker)((_Any_data *)&pCVar1->less,&b_local,&local_28);
        if (bVar6) {
          return LT;
        }
        pCVar1 = (this->compareTypes).a;
        b_local = HVar3;
        local_28.id = kVar2.id;
        if ((pCVar1->less).super__Function_base._M_manager != (_Manager_type)0x0) {
          bVar6 = (*(pCVar1->less)._M_invoker)((_Any_data *)&pCVar1->less,&b_local,&local_28);
          return (uint)bVar6 * 2;
        }
      }
      std::__throw_bad_function_call();
    }
    bVar6 = iVar5.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
            _M_cur == (__node_type *)0x0;
    bVar7 = iVar4.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
            _M_cur != (__node_type *)0x0;
  }
  else {
    bVar6 = 0x7c < b.id;
    bVar7 = a.id < 0x7d;
  }
  return GT - (byte)(bVar7 & bVar6);
}

Assistant:

Comparison compare(HeapType a, HeapType b) {
    if (a.isBasic() != b.isBasic()) {
      return b.isBasic() < a.isBasic() ? LT : GT;
    }
    if (a.isBasic()) {
      if (a.getID() != b.getID()) {
        return a.getID() < b.getID() ? LT : GT;
      }
      return EQ;
    }
    auto itA = indicesA.find(a);
    auto itB = indicesB.find(b);
    bool foundA = itA != indicesA.end();
    bool foundB = itB != indicesB.end();
    if (foundA != foundB) {
      return foundB < foundA ? LT : GT;
    }
    if (foundA) {
      auto indexA = itA->second;
      auto indexB = itB->second;
      if (indexA != indexB) {
        return indexA < indexB ? LT : GT;
      }
      return EQ;
    }
    // These types are external to the group, so fall back to the provided
    // comparator.
    return compareTypes(a, b);
  }